

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

int pludecomp(double *A,int N,int *ipiv)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  uVar4 = 0;
  uVar3 = 0;
  if (0 < N) {
    uVar3 = (ulong)(uint)N;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    ipiv[uVar4] = (int)uVar4;
  }
  iVar6 = 1;
  iVar2 = 1;
  if (1 < N) {
    iVar2 = N;
  }
  lVar12 = (long)N;
  pdVar13 = A + lVar12;
  pdVar14 = A;
  pdVar15 = A;
  for (uVar4 = 0; uVar4 != iVar2 - 1; uVar4 = uVar4 + 1) {
    dVar17 = A[uVar4 * lVar12 + uVar4];
    dVar18 = ABS(dVar17);
    uVar8 = uVar4 & 0xffffffff;
    uVar5 = (ulong)iVar6;
    pdVar9 = pdVar13;
    for (uVar10 = uVar5; (long)uVar10 < lVar12; uVar10 = uVar10 + 1) {
      dVar19 = ABS(*pdVar9);
      if (dVar18 < dVar19) {
        uVar8 = uVar10 & 0xffffffff;
      }
      uVar16 = -(ulong)(dVar18 < dVar19);
      dVar18 = (double)(~uVar16 & (ulong)dVar18 | (ulong)*pdVar9 & uVar16);
      pdVar9 = pdVar9 + lVar12;
    }
    iVar7 = (int)uVar8;
    if (uVar4 != uVar8) {
      iVar1 = ipiv[iVar7];
      ipiv[iVar7] = ipiv[uVar4];
      ipiv[uVar4] = iVar1;
      for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
        dVar17 = pdVar15[uVar10];
        pdVar15[uVar10] = A[(long)(iVar7 * N) + uVar10];
        A[(long)(iVar7 * N) + uVar10] = dVar17;
      }
      dVar17 = A[uVar4 * lVar12 + uVar4];
    }
    pdVar9 = pdVar13;
    if ((dVar17 != 0.0) || (NAN(dVar17))) {
      for (; (long)uVar5 < lVar12; uVar5 = uVar5 + 1) {
        dVar18 = A[uVar4 + uVar5 * lVar12];
        A[uVar4 + uVar5 * lVar12] = dVar18 / dVar17;
        for (lVar11 = 1; (long)(uVar4 + lVar11) < lVar12; lVar11 = lVar11 + 1) {
          pdVar9[lVar11] = pdVar14[lVar11] * -(dVar18 / dVar17) + pdVar9[lVar11];
        }
        pdVar9 = pdVar9 + lVar12;
      }
    }
    iVar6 = iVar6 + 1;
    pdVar13 = pdVar13 + lVar12 + 1;
    pdVar15 = pdVar15 + lVar12;
    pdVar14 = pdVar14 + lVar12 + 1;
  }
  return (int)uVar3;
}

Assistant:

static int pludecomp(double *A,int N,int *ipiv) {
	int k,j,l,c1,c2,mind,tempi;
	double ld,mult,mval,temp;
	for(k=0;k < N;++k)
		ipiv[k] = k;
	
	for(k = 0; k < N-1; ++k) {
		//c2 = k*N;
		mval = fabs(A[k*N + k]);
		mind = k;
		for (j=k+1; j < N;++j) {
			if (mval < fabs(A[j*N + k])) {
				mval = A[j*N + k];
				mind = j;
			}
		}
		
		if ( mind != k) {
			c1 = k *N;
			c2 = mind * N;
			tempi = ipiv[mind];
			ipiv[mind] = ipiv[k];
			ipiv[k] = tempi;
			for (j = 0; j < N;j++) {
				temp = A[c1 + j];
				*(A + c1 + j) = *(A + c2 + j);
				*(A + c2 + j) = temp;
			}
		}
		c2 = k*N;
		ld = A[c2 + k];
		if (ld != 0.) {
			for (j = k+1; j < N; ++j) {
				c1 = j*N;
				mult = A[c1+k] /= ld;
				//printf("\n k %d j %d mult %lf \n",k,j,mult);
				for(l = k+1; l < N; ++l) {
					A[c1+l] -= mult * A[c2 + l];
				}
			}
		}
		
	}
	return 0;
	
}